

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Player.cpp
# Opt level: O2

void __thiscall Player::destroy(Player *this)

{
  al_destroy_bitmap(this->bitmap);
  al_destroy_bitmap(this->trans_bitmap);
  al_destroy_bitmap(this->trail_bitmap);
  al_destroy_bitmap(this->icon);
  al_destroy_bitmap(this->highscoreBitmap);
  this->trail_bitmap = (ALLEGRO_BITMAP *)0x0;
  this->icon = (ALLEGRO_BITMAP *)0x0;
  this->bitmap = (ALLEGRO_BITMAP *)0x0;
  this->trans_bitmap = (ALLEGRO_BITMAP *)0x0;
  this->highscoreBitmap = (ALLEGRO_BITMAP *)0x0;
  return;
}

Assistant:

void Player::destroy(void)
{
   al_destroy_bitmap(bitmap);
   al_destroy_bitmap(trans_bitmap);
   al_destroy_bitmap(trail_bitmap);
   al_destroy_bitmap(icon);
   al_destroy_bitmap(highscoreBitmap);
   bitmap = 0;
   trans_bitmap = 0;
   trail_bitmap = 0;
   icon = 0;
   highscoreBitmap = 0;
}